

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_SetRenderStyle
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  DObject *this;
  char *pcVar5;
  double dVar6;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003e3ace;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003e3abe:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003e3ace:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xcc4,
                  "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (DObject *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (DObject *)0x0) goto LAB_003e3a32;
    bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
    if (!bVar3) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003e3ace;
    }
  }
  else {
    if (this != (DObject *)0x0) goto LAB_003e3abe;
LAB_003e3a32:
    this = (DObject *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      dVar1 = param[1].field_0.f;
      if ((uint)numparam < 3) {
        param = defaultparam->Array;
        if (param[2].field_0.field_3.Type == '\0') goto LAB_003e3a74;
        pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
LAB_003e3a74:
          uVar2 = param[2].field_0.i;
          dVar6 = 1.0;
          if (dVar1 <= 1.0) {
            dVar6 = dVar1;
          }
          this[7]._vptr_DObject = (_func_int **)(-(ulong)(0.0 < dVar1) & (ulong)dVar6);
          uVar4 = (ulong)uVar2;
          if (0xd < uVar2) {
            uVar4 = 0;
          }
          *(FRenderStyle *)&this[6].GCNext = LegacyRenderStyles[uVar4];
          return 0;
        }
        pcVar5 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xcc6,
                    "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar5 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0xcc5,
                "int AF_AActor_A_SetRenderStyle(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetRenderStyle)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(alpha);
	PARAM_INT_DEF(mode);

	self->Alpha = clamp(alpha, 0., 1.);
	self->RenderStyle = ERenderStyle(mode);
	return 0;
}